

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::pack_unorm_4x8
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  char *__s;
  DataType in_R9D;
  DataType *pDVar2;
  int dataTypeNdx;
  long lVar3;
  allocator<char> local_d9;
  long local_d8;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"packUnorm4x8: Invalid v type.",(allocator<char> *)&local_b0);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  lVar3 = 0;
LAB_0135e742:
  if (lVar3 == 6) {
    NegativeTestContext::endSection(ctx);
    return;
  }
  shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar3];
  bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
  if (bVar1) {
    __s = glu::getShaderTypeName(shaderType);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_d9);
    std::operator+(&shaderSource,"Verify shader: ",&local_b0);
    local_d8 = lVar3;
    NegativeTestContext::beginSection(ctx,&shaderSource);
    std::__cxx11::string::~string((string *)&shaderSource);
    std::__cxx11::string::~string((string *)&local_b0);
    pDVar2 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes;
    lVar3 = 0;
    do {
      if (lVar3 != 3) {
        if (lVar3 == 4) goto LAB_0135e812;
        NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,10,*pDVar2,in_R9D);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
      }
      lVar3 = lVar3 + 1;
      pDVar2 = pDVar2 + 1;
    } while( true );
  }
  goto LAB_0135e8c5;
LAB_0135e812:
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
    NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
              (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType,
               10,*(ShaderFunction *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar3),
               in_R9D);
    std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
    verifyShader(ctx,shaderType,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&shaderSource);
    NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
              (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType,
               10,*(ShaderFunction *)
                   ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar3)
               ,in_R9D);
    std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
    verifyShader(ctx,shaderType,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&shaderSource);
  }
  NegativeTestContext::endSection(ctx);
  lVar3 = local_d8;
LAB_0135e8c5:
  lVar3 = lVar3 + 1;
  goto LAB_0135e742;
}

Assistant:

void pack_unorm_4x8 (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("packUnorm4x8: Invalid v type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				if (s_floatTypes[dataTypeNdx] == glu::TYPE_FLOAT_VEC4)
					continue;

				const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_PACK_UNORM_4X8, s_floatTypes[dataTypeNdx]));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}

			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_PACK_UNORM_4X8, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_PACK_UNORM_4X8, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}